

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O0

void pbrt::RadixSort(vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *v)

{
  int iVar1;
  uint32_t uVar2;
  vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *this;
  bool bVar3;
  uint uVar4;
  reference pMVar5;
  reference pvVar6;
  vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *in_RDI;
  int bucket_1;
  MortonPrimitive *mp_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *__range2_1;
  int i;
  int outIndex [64];
  int vb_1;
  int va_1;
  int vb;
  int va;
  int bucket;
  MortonPrimitive *mp;
  iterator __end2;
  iterator __begin2;
  vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *__range2;
  int bitMask;
  int bucketCount [64];
  int nBuckets;
  vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *out;
  vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *in;
  int lowBit;
  int pass;
  int nPasses;
  int nBits;
  int bitsPerPass;
  vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> tempVector;
  vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *in_stack_fffffffffffffcd8;
  vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *in_stack_fffffffffffffce0;
  allocator_type *in_stack_fffffffffffffcf0;
  size_type in_stack_fffffffffffffcf8;
  vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *in_stack_fffffffffffffd00;
  vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *local_2f8;
  vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *local_2f0;
  undefined4 in_stack_fffffffffffffd28;
  uint in_stack_fffffffffffffd2c;
  reference in_stack_fffffffffffffd30;
  iterator in_stack_fffffffffffffd38;
  iterator in_stack_fffffffffffffd40;
  vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *in_stack_fffffffffffffd48;
  LogLevel in_stack_fffffffffffffd54;
  int local_2a8 [2];
  char (*in_stack_fffffffffffffd60) [7];
  int *in_stack_fffffffffffffd68;
  char (*in_stack_fffffffffffffd70) [9];
  int *in_stack_fffffffffffffd78;
  __normal_iterator<pbrt::MortonPrimitive_*,_std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>_>
  local_180;
  vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *local_178;
  undefined4 local_16c;
  int local_168 [67];
  undefined4 local_5c;
  vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *local_58;
  vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *local_50;
  int local_48;
  uint local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> local_20;
  vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *local_8;
  
  local_8 = in_RDI;
  std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>::size(in_RDI);
  std::allocator<pbrt::MortonPrimitive>::allocator((allocator<pbrt::MortonPrimitive> *)0x7cbef3);
  std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>::vector
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
  std::allocator<pbrt::MortonPrimitive>::~allocator((allocator<pbrt::MortonPrimitive> *)0x7cbf19);
  local_38 = 6;
  local_3c = 0x1e;
  local_40 = 5;
  local_44 = 0;
  do {
    if (4 < (int)local_44) {
      std::swap<pbrt::MortonPrimitive,std::allocator<pbrt::MortonPrimitive>>
                (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
      std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>::~vector
                ((vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *)
                 in_stack_fffffffffffffcf0);
      return;
    }
    local_48 = local_44 * 6;
    if ((local_44 & 1) == 0) {
      local_2f0 = local_8;
    }
    else {
      local_2f0 = &local_20;
    }
    local_50 = local_2f0;
    if ((local_44 & 1) == 0) {
      local_2f8 = &local_20;
    }
    else {
      local_2f8 = local_8;
    }
    local_58 = local_2f8;
    local_5c = 0x40;
    memset(local_168,0,0x100);
    local_16c = 0x3f;
    local_178 = local_50;
    local_180._M_current =
         (MortonPrimitive *)
         std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>::begin
                   (in_stack_fffffffffffffcd8);
    std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>::end
              (in_stack_fffffffffffffcd8);
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<pbrt::MortonPrimitive_*,_std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>_>
                               *)in_stack_fffffffffffffce0,
                              (__normal_iterator<pbrt::MortonPrimitive_*,_std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>_>
                               *)in_stack_fffffffffffffcd8), bVar3) {
      pMVar5 = __gnu_cxx::
               __normal_iterator<pbrt::MortonPrimitive_*,_std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>_>
               ::operator*(&local_180);
      uVar4 = pMVar5->mortonCode >> ((byte)local_48 & 0x1f) & 0x3f;
      if (0x3f < uVar4) {
        LogFatal<char_const(&)[7],char_const(&)[9],char_const(&)[7],int&,char_const(&)[9],int&>
                  (in_stack_fffffffffffffd54,(char *)in_stack_fffffffffffffd48,
                   (int)((ulong)in_stack_fffffffffffffd40._M_current >> 0x20),
                   (char *)in_stack_fffffffffffffd38._M_current,
                   (char (*) [7])in_stack_fffffffffffffd30,
                   (char (*) [9])CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                   in_stack_fffffffffffffd60,in_stack_fffffffffffffd68,in_stack_fffffffffffffd70,
                   in_stack_fffffffffffffd78);
      }
      local_168[(int)uVar4] = local_168[(int)uVar4] + 1;
      __gnu_cxx::
      __normal_iterator<pbrt::MortonPrimitive_*,_std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>_>
      ::operator++(&local_180);
    }
    local_2a8[0] = 0;
    for (in_stack_fffffffffffffd54 = Error; (int)in_stack_fffffffffffffd54 < 0x40;
        in_stack_fffffffffffffd54 = in_stack_fffffffffffffd54 + Error) {
      local_2a8[(int)in_stack_fffffffffffffd54] =
           local_2a8[(int)(in_stack_fffffffffffffd54 - Error)] +
           local_168[(int)(in_stack_fffffffffffffd54 - Error)];
    }
    in_stack_fffffffffffffd48 = local_50;
    in_stack_fffffffffffffd40 =
         std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>::begin
                   (in_stack_fffffffffffffcd8);
    in_stack_fffffffffffffd38 =
         std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>::end
                   (in_stack_fffffffffffffcd8);
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<pbrt::MortonPrimitive_*,_std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>_>
                               *)in_stack_fffffffffffffce0,
                              (__normal_iterator<pbrt::MortonPrimitive_*,_std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>_>
                               *)in_stack_fffffffffffffcd8), bVar3) {
      pMVar5 = __gnu_cxx::
               __normal_iterator<pbrt::MortonPrimitive_*,_std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>_>
               ::operator*((__normal_iterator<pbrt::MortonPrimitive_*,_std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>_>
                            *)&stack0xfffffffffffffd40);
      this = local_58;
      in_stack_fffffffffffffd2c = pMVar5->mortonCode >> ((byte)local_48 & 0x1f) & 0x3f;
      iVar1 = local_2a8[(int)in_stack_fffffffffffffd2c];
      local_2a8[(int)in_stack_fffffffffffffd2c] = iVar1 + 1;
      in_stack_fffffffffffffd30 = pMVar5;
      pvVar6 = std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>::
               operator[](this,(long)iVar1);
      uVar2 = pMVar5->mortonCode;
      pvVar6->primitiveIndex = pMVar5->primitiveIndex;
      pvVar6->mortonCode = uVar2;
      __gnu_cxx::
      __normal_iterator<pbrt::MortonPrimitive_*,_std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>_>
      ::operator++((__normal_iterator<pbrt::MortonPrimitive_*,_std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>_>
                    *)&stack0xfffffffffffffd40);
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

static void RadixSort(std::vector<MortonPrimitive> *v) {
    std::vector<MortonPrimitive> tempVector(v->size());
    constexpr int bitsPerPass = 6;
    constexpr int nBits = 30;
    static_assert((nBits % bitsPerPass) == 0,
                  "Radix sort bitsPerPass must evenly divide nBits");
    constexpr int nPasses = nBits / bitsPerPass;
    for (int pass = 0; pass < nPasses; ++pass) {
        // Perform one pass of radix sort, sorting _bitsPerPass_ bits
        int lowBit = pass * bitsPerPass;
        // Set in and out vector references for radix sort pass
        std::vector<MortonPrimitive> &in = (pass & 1) ? tempVector : *v;
        std::vector<MortonPrimitive> &out = (pass & 1) ? *v : tempVector;

        // Count number of zero bits in array for current radix sort bit
        constexpr int nBuckets = 1 << bitsPerPass;
        int bucketCount[nBuckets] = {0};
        constexpr int bitMask = (1 << bitsPerPass) - 1;
        for (const MortonPrimitive &mp : in) {
            int bucket = (mp.mortonCode >> lowBit) & bitMask;
            CHECK_GE(bucket, 0);
            CHECK_LT(bucket, nBuckets);
            ++bucketCount[bucket];
        }

        // Compute starting index in output array for each bucket
        int outIndex[nBuckets];
        outIndex[0] = 0;
        for (int i = 1; i < nBuckets; ++i)
            outIndex[i] = outIndex[i - 1] + bucketCount[i - 1];

        // Store sorted values in output array
        for (const MortonPrimitive &mp : in) {
            int bucket = (mp.mortonCode >> lowBit) & bitMask;
            out[outIndex[bucket]++] = mp;
        }
    }
    // Copy final result from _tempVector_, if needed
    if (nPasses & 1)
        std::swap(*v, tempVector);
}